

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# master_link.cpp
# Opt level: O2

void __thiscall
miniros::MasterLink::paramUpdateCallback(MasterLink *this,RpcValue *params,RpcValue *result)

{
  XmlRpcValue *pXVar1;
  string *psVar2;
  allocator<char> local_59;
  string local_58;
  XmlRpcValue local_38;
  
  local_58._M_dataplus._M_p._0_4_ = 1;
  pXVar1 = XmlRpc::XmlRpcValue::operator[](result,0);
  XmlRpc::XmlRpcValue::operator=(pXVar1,(int *)&local_58);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"",&local_59);
  XmlRpc::XmlRpcValue::XmlRpcValue(&local_38,&local_58);
  pXVar1 = XmlRpc::XmlRpcValue::operator[](result,1);
  XmlRpc::XmlRpcValue::operator=(pXVar1,&local_38);
  XmlRpc::XmlRpcValue::~XmlRpcValue(&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  local_58._M_dataplus._M_p._0_4_ = 0;
  pXVar1 = XmlRpc::XmlRpcValue::operator[](result,2);
  XmlRpc::XmlRpcValue::operator=(pXVar1,(int *)&local_58);
  pXVar1 = XmlRpc::XmlRpcValue::operator[](params,1);
  psVar2 = XmlRpc::XmlRpcValue::operator_cast_to_string_(pXVar1);
  std::__cxx11::string::string((string *)&local_58,(string *)psVar2);
  pXVar1 = XmlRpc::XmlRpcValue::operator[](params,2);
  update(this,&local_58,pXVar1);
  std::__cxx11::string::~string((string *)&local_58);
  return;
}

Assistant:

void MasterLink::paramUpdateCallback(const RpcValue& params, RpcValue& result)
{
  result[0] = 1;
  result[1] = std::string("");
  result[2] = 0;

  this->update((std::string)params[1], params[2]);
}